

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int forward_message_udp(socket_server *ss,socket *s,socket_message *result)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  void *local_58;
  uint8_t *data;
  socklen_t local_48;
  int n;
  socklen_t slen;
  sockaddr_all sa;
  socket_message *result_local;
  socket *s_local;
  socket_server *ss_local;
  
  local_48 = 0x1c;
  sa._20_8_ = result;
  result_local = (socket_message *)s;
  s_local = (socket *)ss;
  sVar2 = recvfrom(s->fd,ss->udpbuffer,0xffff,0,(sockaddr *)&n,&local_48);
  iVar1 = (int)sVar2;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if ((*piVar3 == 4) || (*piVar3 == 0xb)) {
      ss_local._4_4_ = -1;
    }
    else {
      force_close((socket_server *)s_local,(socket *)result_local,(socket_message *)sa._20_8_);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      *(char **)(sa._20_8_ + 0x18) = pcVar4;
      ss_local._4_4_ = 4;
    }
  }
  else {
    if (local_48 == 0x10) {
      if (*(short *)&result_local[1].data != 1) {
        return -1;
      }
      local_58 = malloc((long)(iVar1 + 7));
      gen_udp_address(1,(sockaddr_all *)&n,(uint8_t *)((long)local_58 + (long)iVar1));
    }
    else {
      if (*(short *)&result_local[1].data != 2) {
        return -1;
      }
      local_58 = malloc((long)(iVar1 + 0x13));
      gen_udp_address(2,(sockaddr_all *)&n,(uint8_t *)((long)local_58 + (long)iVar1));
    }
    memcpy(local_58,&s_local[0x1000f].high,(long)iVar1);
    *(undefined8 *)(sa._20_8_ + 8) = *(undefined8 *)result_local;
    *(undefined4 *)sa._20_8_ = *(undefined4 *)&result_local[1].field_0x14;
    *(int *)(sa._20_8_ + 0x10) = iVar1;
    *(void **)(sa._20_8_ + 0x18) = local_58;
    ss_local._4_4_ = 6;
  }
  return ss_local._4_4_;
}

Assistant:

static int
forward_message_udp(struct socket_server *ss, struct socket *s, struct socket_message * result) {
	union sockaddr_all sa;
	socklen_t slen = sizeof(sa);
	int n = recvfrom(s->fd, ss->udpbuffer,MAX_UDP_PACKAGE,0,&sa.s,&slen);
	if (n<0) {
		switch(errno) {
		case EINTR:
		case EAGAIN:
			break;
		default:
			// close when error
			force_close(ss, s, result);
			result->data = strerror(errno);
			return SOCKET_ERROR;
		}
		return -1;
	}
	uint8_t * data;
	if (slen == sizeof(sa.v4)) {
		if (s->protocol != PROTOCOL_UDP)
			return -1;
		data = MALLOC(n + 1 + 2 + 4);
		gen_udp_address(PROTOCOL_UDP, &sa, data + n);
	} else {
		if (s->protocol != PROTOCOL_UDPv6)
			return -1;
		data = MALLOC(n + 1 + 2 + 16);
		gen_udp_address(PROTOCOL_UDPv6, &sa, data + n);
	}
	memcpy(data, ss->udpbuffer, n);

	result->opaque = s->opaque;
	result->id = s->id;
	result->ud = n;
	result->data = (char *)data;

	return SOCKET_UDP;
}